

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

int fio_str_free(fio_str_s *s)

{
  uint32_t in_EAX;
  void *pvVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined3 uStack_20;
  undefined5 uStack_1d;
  undefined3 uStack_18;
  undefined8 uStack_15;
  
  if (s != (fio_str_s *)0x0) {
    LOCK();
    in_EAX = s->ref;
    s->ref = s->ref - 1;
    UNLOCK();
    if (in_EAX == 0) {
      if ((s->small == '\0') && (s->dealloc != (_func_void_void_ptr *)0x0)) {
        (*s->dealloc)(s->data);
      }
      local_38 = 0;
      uStack_30 = 0;
      local_28 = 0;
      uStack_20 = 0;
      uStack_1d = 0;
      uStack_18 = 0;
      uStack_15 = 0;
      s->ref = 0;
      s->small = '\x01';
      pvVar1 = memcpy(&s->frozen,&local_38,0x2b);
      in_EAX = (uint32_t)pvVar1;
    }
  }
  return in_EAX;
}

Assistant:

inline FIO_FUNC int fio_str_free(fio_str_s *s) {
#ifndef FIO_STR_NO_REF
  if (!s || fio_atomic_sub(&s->ref, 1) != (uint32_t)-1)
    return -1;
#endif
  if (!s->small && s->dealloc)
    s->dealloc(s->data);
  *s = FIO_STR_INIT;
  return 0;
}